

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.hpp
# Opt level: O0

Expression * __thiscall GetTupleElement::visit_intrinsic(GetTupleElement *this,Intrinsic *intrinsic)

{
  bool bVar1;
  vector<const_Expression_*,_std::allocator<const_Expression_*>_> *this_00;
  const_reference ppEVar2;
  StringView local_30;
  Intrinsic *local_20;
  Intrinsic *intrinsic_local;
  GetTupleElement *this_local;
  
  local_20 = intrinsic;
  intrinsic_local = (Intrinsic *)this;
  StringView::StringView(&local_30,"reference");
  bVar1 = Intrinsic::name_equals(intrinsic,&local_30);
  if (bVar1) {
    this_00 = Intrinsic::get_arguments(local_20);
    ppEVar2 = std::vector<const_Expression_*,_std::allocator<const_Expression_*>_>::operator[]
                        (this_00,0);
    this_local = (GetTupleElement *)
                 visit<Expression_const*>(&this->super_Visitor<const_Expression_*>,*ppEVar2);
  }
  else {
    this_local = (GetTupleElement *)0x0;
  }
  return (Expression *)this_local;
}

Assistant:

const Expression* visit_intrinsic(const Intrinsic& intrinsic) override {
		if (intrinsic.name_equals("reference")) {
			return visit(*this, intrinsic.get_arguments()[0]);
		}
		return nullptr;
	}